

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O0

void dbgpbval(dbgcxdef *ctx,dattyp typ,uchar *val,_func_void_void_ptr_char_ptr_int *dispfn,
             void *dispctx)

{
  long lVar1;
  size_t sVar2;
  code *in_RCX;
  char *pcVar3;
  void *in_RDX;
  int in_ESI;
  _func_void_void_ptr_char_ptr_int *in_R8;
  uint len;
  char *p;
  char buf [40];
  uint *in_stack_ffffffffffffff58;
  uchar **in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar4;
  char *local_60;
  char local_58 [40];
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  
  local_60 = local_58;
  pcVar3 = (char *)(ulong)(in_ESI - 1);
  switch(pcVar3) {
  case (char *)0x0:
    pcVar3 = local_58;
    lVar1 = osrp4s(in_RDX);
    sprintf(pcVar3,"%ld",lVar1);
    sVar2 = strlen(local_58);
    iVar4 = (int)sVar2;
    break;
  case (char *)0x1:
    osrp2(in_RDX);
    iVar4 = dbgnam((dbgcxdef *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),pcVar3,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
    break;
  case (char *)0x2:
    iVar4 = osrp2(in_RDX);
    iVar4 = iVar4 + -2;
    local_60 = (char *)((long)in_RDX + 2);
    break;
  default:
    local_60 = "[unknown type]";
    iVar4 = 0xe;
    break;
  case (char *)0x4:
    local_60 = "nil";
    iVar4 = 3;
    break;
  case (char *)0x6:
    (*in_RCX)(in_R8,"[",1);
    iVar4 = osrp2(in_RDX);
    iVar4 = iVar4 + -2;
    local_60 = (char *)((long)in_RDX + 2);
    while (iVar4 != 0) {
      dbgpbval((dbgcxdef *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (dattyp)((ulong)in_RDX >> 0x20),(uchar *)in_RCX,in_R8,in_stack_ffffffffffffffd0);
      lstadv(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (iVar4 != 0) {
        (*in_RCX)(in_R8," ",1);
      }
    }
    (*in_RCX)(in_R8,"]",1);
    iVar4 = 0;
    break;
  case (char *)0x7:
    local_60 = "true";
    iVar4 = 4;
    break;
  case (char *)0x9:
    (*in_RCX)(in_R8,"&",1);
    osrp2(in_RDX);
    iVar4 = dbgnam((dbgcxdef *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),pcVar3,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
    break;
  case (char *)0xc:
    (*in_RCX)(in_R8,"&",1);
    osrp2(in_RDX);
    iVar4 = dbgnam((dbgcxdef *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),pcVar3,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  }
  if (in_ESI == 3) {
    (*in_RCX)(in_R8,"\'",1);
  }
  if (iVar4 != 0) {
    (*in_RCX)(in_R8,local_60,iVar4);
  }
  if (in_ESI == 3) {
    (*in_RCX)(in_R8,"\'",1);
  }
  return;
}

Assistant:

static void dbgpbval(dbgcxdef *ctx, dattyp typ, uchar *val,
                     void (*dispfn)(void *, const char *, int),
                     void *dispctx)
{
    char  buf[TOKNAMMAX + 1];
    char *p = buf;
    uint  len;

    switch(typ)
    {
    case DAT_NUMBER:
        sprintf(buf, "%ld", (long)osrp4s(val));
        len = strlen(buf);
        break;
        
    case DAT_OBJECT:
        len = dbgnam(ctx, buf, TOKSTOBJ, osrp2(val));
        break;
        
    case DAT_SSTRING:
        len = osrp2(val) - 2;
        p = (char *)val + 2;
        break;
        
    case DAT_NIL:
        p = "nil";
        len = 3;
        break;

    case DAT_LIST:
        (*dispfn)(dispctx, "[", 1);
        len = osrp2(val) - 2;
        p = (char *)val + 2;
        while (len)
        {
            dbgpbval(ctx, (dattyp)*p, (uchar *)(p + 1), dispfn, dispctx);
            lstadv((uchar **)&p, &len);
            if (len) (*dispfn)(dispctx, " ", 1);
        }
        (*dispfn)(dispctx, "]", 1);
        len = 0;
        break;
        
    case DAT_TRUE:
        p = "true";
        len = 4;
        break;
        
    case DAT_FNADDR:
        (*dispfn)(dispctx, "&", 1);
        len = dbgnam(ctx, buf, TOKSTFUNC, osrp2(val));
        break;
        
    case DAT_PROPNUM:
        (*dispfn)(dispctx, "&", 1);
        len = dbgnam(ctx, buf, TOKSTPROP, osrp2(val));
        break;
        
    default:
        p = "[unknown type]";
        len = 14;
        break;
    }

    if (typ == DAT_SSTRING) (*dispfn)(dispctx, "'", 1);
    if (len) (*dispfn)(dispctx, p, len);
    if (typ == DAT_SSTRING) (*dispfn)(dispctx, "'", 1);
}